

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train_cmd_ln.c
# Opt level: O0

int validate_readable_dir(char *switch_name,void *arg)

{
  int iVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  undefined1 local_b8 [8];
  stat s;
  char *path;
  void *arg_local;
  char *switch_name_local;
  
  s.__glibc_reserved[2] = (__syscall_slong_t)arg;
  if (arg == (void *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
            ,0x9a,"%s is a necessary switch\n",switch_name);
    switch_name_local._4_4_ = 0;
  }
  else {
    iVar1 = stat((char *)arg,(stat *)local_b8);
    if (iVar1 < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
              ,0xa0,"%s %s does not exist or is inaccessible\n",switch_name,s.__glibc_reserved[2]);
      switch_name_local._4_4_ = 0;
    }
    else if (((uint)s.st_nlink & 0xf000) == 0x4000) {
      if ((((uint)s.st_nlink == 0) &&
          ((_Var2 = getuid(), s.st_nlink._4_4_ != _Var2 || ((uint)s.st_nlink == 0)))) &&
         ((_Var3 = getgid(), s.st_mode != _Var3 || ((uint)s.st_nlink == 0)))) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
                ,0xb1,"%s %s is not readable\n",switch_name,s.__glibc_reserved[2]);
        return 0;
      }
      switch_name_local._4_4_ = 1;
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/train_cmd_ln.c"
              ,0xa6,"%s %s is not a directory\n",switch_name,s.__glibc_reserved[2]);
      switch_name_local._4_4_ = 0;
    }
  }
  return switch_name_local._4_4_;
}

Assistant:

int
validate_readable_dir(char *switch_name, void *arg)
{
#ifndef _WIN32
    char *path = arg;
    struct stat s;

    if (path == NULL) {
	E_ERROR("%s is a necessary switch\n", switch_name);

	return FALSE;
    }

    if (stat(path, &s) < 0) {
	E_ERROR("%s %s does not exist or is inaccessible\n", switch_name, path);

	return FALSE;
    }

    if (!S_ISDIR(s.st_mode)) {
	E_ERROR("%s %s is not a directory\n", switch_name, path);

	return FALSE;
    }	

    if ((s.st_mode && S_IROTH) ||
	((s.st_uid == getuid()) && (s.st_mode && S_IRUSR)) ||
	((s.st_gid == getgid()) && (s.st_mode && S_IRGRP))) {
	return TRUE;
    }
    else {
	E_ERROR("%s %s is not readable\n", switch_name, path);

	return FALSE;
    }
#else
    /* _WIN32 */

    /* Do no validation for now.  Need to figure out a _WIN32 compatible
       way */

    return TRUE;
#endif
}